

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

int run_test_fs_file_noent(void)

{
  int iVar1;
  uv_loop_t *loop;
  undefined8 uVar2;
  char *pcVar3;
  uv_fs_t req;
  undefined1 local_1c0 [88];
  long local_168;
  
  ::loop = (uv_loop_t *)uv_default_loop();
  iVar1 = uv_fs_open(0,local_1c0,"does_not_exist",0,0,0);
  if (iVar1 == -2) {
    if (local_168 == -2) {
      uv_fs_req_cleanup(local_1c0);
      iVar1 = uv_fs_open(::loop,local_1c0,"does_not_exist",0,0,open_noent_cb);
      if (iVar1 == 0) {
        if (open_cb_count == 0) {
          uv_run(::loop,0);
          if (open_cb_count == 1) {
            loop = (uv_loop_t *)uv_default_loop();
            close_loop(loop);
            uVar2 = uv_default_loop();
            iVar1 = uv_loop_close(uVar2);
            if (iVar1 == 0) {
              return 0;
            }
            pcVar3 = "0 == uv_loop_close(uv_default_loop())";
            uVar2 = 0x2e0;
          }
          else {
            pcVar3 = "open_cb_count == 1";
            uVar2 = 0x2dc;
          }
        }
        else {
          pcVar3 = "open_cb_count == 0";
          uVar2 = 0x2da;
        }
      }
      else {
        pcVar3 = "r == 0";
        uVar2 = 0x2d8;
      }
    }
    else {
      pcVar3 = "req.result == UV_ENOENT";
      uVar2 = 0x2d4;
    }
  }
  else {
    pcVar3 = "r == UV_ENOENT";
    uVar2 = 0x2d3;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(fs_file_noent) {
  uv_fs_t req;
  int r;

  loop = uv_default_loop();

  r = uv_fs_open(NULL, &req, "does_not_exist", O_RDONLY, 0, NULL);
  ASSERT(r == UV_ENOENT);
  ASSERT(req.result == UV_ENOENT);
  uv_fs_req_cleanup(&req);

  r = uv_fs_open(loop, &req, "does_not_exist", O_RDONLY, 0, open_noent_cb);
  ASSERT(r == 0);

  ASSERT(open_cb_count == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(open_cb_count == 1);

  /* TODO add EACCES test */

  MAKE_VALGRIND_HAPPY();
  return 0;
}